

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostConfigFlags.cpp
# Opt level: O0

int __thiscall
HostConfigFlags::FindArg
          (HostConfigFlags *this,int argc,PWSTR *argv,PCWSTR targetArg,size_t targetArgLen)

{
  int iVar1;
  anon_class_16_2_aada32a2 func;
  size_t targetArgLen_local;
  PCWSTR targetArg_local;
  PWSTR *argv_local;
  int argc_local;
  
  func.targetArgLen = targetArgLen;
  func.targetArg = targetArg;
  iVar1 = FindArg<HostConfigFlags::FindArg(int,char16_t**,char16_t_const*,unsigned_long)::__0>
                    ((HostConfigFlags *)((ulong)this & 0xffffffff),argc,argv,func);
  return iVar1;
}

Assistant:

int HostConfigFlags::FindArg(int argc, _In_reads_(argc) PWSTR argv[], PCWSTR targetArg, size_t targetArgLen)
{
    return FindArg(argc, argv, [=](PCWSTR arg) -> bool
    {
        return _wcsnicmp(arg, targetArg, targetArgLen) == 0;
    });
}